

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_command_list(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_command_list != 0) {
    glad_glCreateStatesNV = (PFNGLCREATESTATESNVPROC)(*load)("glCreateStatesNV");
    glad_glDeleteStatesNV = (PFNGLDELETESTATESNVPROC)(*load)("glDeleteStatesNV");
    glad_glIsStateNV = (PFNGLISSTATENVPROC)(*load)("glIsStateNV");
    glad_glStateCaptureNV = (PFNGLSTATECAPTURENVPROC)(*load)("glStateCaptureNV");
    glad_glGetCommandHeaderNV = (PFNGLGETCOMMANDHEADERNVPROC)(*load)("glGetCommandHeaderNV");
    glad_glGetStageIndexNV = (PFNGLGETSTAGEINDEXNVPROC)(*load)("glGetStageIndexNV");
    glad_glDrawCommandsNV = (PFNGLDRAWCOMMANDSNVPROC)(*load)("glDrawCommandsNV");
    glad_glDrawCommandsAddressNV =
         (PFNGLDRAWCOMMANDSADDRESSNVPROC)(*load)("glDrawCommandsAddressNV");
    glad_glDrawCommandsStatesNV = (PFNGLDRAWCOMMANDSSTATESNVPROC)(*load)("glDrawCommandsStatesNV");
    glad_glDrawCommandsStatesAddressNV =
         (PFNGLDRAWCOMMANDSSTATESADDRESSNVPROC)(*load)("glDrawCommandsStatesAddressNV");
    glad_glCreateCommandListsNV = (PFNGLCREATECOMMANDLISTSNVPROC)(*load)("glCreateCommandListsNV");
    glad_glDeleteCommandListsNV = (PFNGLDELETECOMMANDLISTSNVPROC)(*load)("glDeleteCommandListsNV");
    glad_glIsCommandListNV = (PFNGLISCOMMANDLISTNVPROC)(*load)("glIsCommandListNV");
    glad_glListDrawCommandsStatesClientNV =
         (PFNGLLISTDRAWCOMMANDSSTATESCLIENTNVPROC)(*load)("glListDrawCommandsStatesClientNV");
    glad_glCommandListSegmentsNV =
         (PFNGLCOMMANDLISTSEGMENTSNVPROC)(*load)("glCommandListSegmentsNV");
    glad_glCompileCommandListNV = (PFNGLCOMPILECOMMANDLISTNVPROC)(*load)("glCompileCommandListNV");
    glad_glCallCommandListNV = (PFNGLCALLCOMMANDLISTNVPROC)(*load)("glCallCommandListNV");
  }
  return;
}

Assistant:

static void load_GL_NV_command_list(GLADloadproc load) {
	if(!GLAD_GL_NV_command_list) return;
	glad_glCreateStatesNV = (PFNGLCREATESTATESNVPROC)load("glCreateStatesNV");
	glad_glDeleteStatesNV = (PFNGLDELETESTATESNVPROC)load("glDeleteStatesNV");
	glad_glIsStateNV = (PFNGLISSTATENVPROC)load("glIsStateNV");
	glad_glStateCaptureNV = (PFNGLSTATECAPTURENVPROC)load("glStateCaptureNV");
	glad_glGetCommandHeaderNV = (PFNGLGETCOMMANDHEADERNVPROC)load("glGetCommandHeaderNV");
	glad_glGetStageIndexNV = (PFNGLGETSTAGEINDEXNVPROC)load("glGetStageIndexNV");
	glad_glDrawCommandsNV = (PFNGLDRAWCOMMANDSNVPROC)load("glDrawCommandsNV");
	glad_glDrawCommandsAddressNV = (PFNGLDRAWCOMMANDSADDRESSNVPROC)load("glDrawCommandsAddressNV");
	glad_glDrawCommandsStatesNV = (PFNGLDRAWCOMMANDSSTATESNVPROC)load("glDrawCommandsStatesNV");
	glad_glDrawCommandsStatesAddressNV = (PFNGLDRAWCOMMANDSSTATESADDRESSNVPROC)load("glDrawCommandsStatesAddressNV");
	glad_glCreateCommandListsNV = (PFNGLCREATECOMMANDLISTSNVPROC)load("glCreateCommandListsNV");
	glad_glDeleteCommandListsNV = (PFNGLDELETECOMMANDLISTSNVPROC)load("glDeleteCommandListsNV");
	glad_glIsCommandListNV = (PFNGLISCOMMANDLISTNVPROC)load("glIsCommandListNV");
	glad_glListDrawCommandsStatesClientNV = (PFNGLLISTDRAWCOMMANDSSTATESCLIENTNVPROC)load("glListDrawCommandsStatesClientNV");
	glad_glCommandListSegmentsNV = (PFNGLCOMMANDLISTSEGMENTSNVPROC)load("glCommandListSegmentsNV");
	glad_glCompileCommandListNV = (PFNGLCOMPILECOMMANDLISTNVPROC)load("glCompileCommandListNV");
	glad_glCallCommandListNV = (PFNGLCALLCOMMANDLISTNVPROC)load("glCallCommandListNV");
}